

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O0

ssize_t __thiscall
booster::aio::stream_socket::read(stream_socket *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  undefined4 in_register_00000034;
  size_t n;
  size_t count;
  mutable_buffer tmp;
  mutable_buffer *in_stack_ffffffffffffff68;
  mutable_buffer *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  mutable_buffer *in_stack_ffffffffffffff90;
  stream_socket *in_stack_ffffffffffffff98;
  mutable_buffer *in_stack_ffffffffffffffa0;
  long local_58;
  buffer_impl<char_*> local_50;
  error_code *local_20;
  undefined8 local_18;
  stream_socket *local_10;
  long local_8;
  
  local_18 = CONCAT44(in_register_00000034,__fd);
  local_20 = (error_code *)__buf;
  local_10 = this;
  mutable_buffer::mutable_buffer(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  local_58 = 0;
  while (bVar1 = buffer_impl<char_*>::empty(&local_50), ((bVar1 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffff90 =
         (mutable_buffer *)
         read_some(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                   (error_code *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    local_58 = (long)&(in_stack_ffffffffffffff90->super_buffer_impl<char_*>).size_ + local_58;
    bVar1 = std::error_code::operator_cast_to_bool(local_20);
    if (bVar1) break;
    operator+=(in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98);
  }
  local_8 = local_58;
  mutable_buffer::~mutable_buffer((mutable_buffer *)0x219fcd);
  return local_8;
}

Assistant:

size_t stream_socket::read(mutable_buffer const &buffer,system::error_code &e)
{
	mutable_buffer tmp = buffer;
	size_t count = 0;
	while(!tmp.empty()) {
		size_t n = read_some(tmp,e);
		count+=n;
		if(e) return count;
		tmp+=n;
	}
	return count;
}